

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O2

string * __thiscall Wiener::getParameter(string *__return_storage_ptr__,Wiener *this,string *name)

{
  bool bVar1;
  double dVar2;
  stringstream param;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = std::operator==(name,"mean");
  if (bVar1) {
    dVar2 = this->wienerMean / (this->wienerSqrtDt * this->wienerSqrtDt);
  }
  else {
    bVar1 = std::operator==(name,"variance");
    if (!bVar1) {
      Parametric::getParameter(&local_1c0,(Parametric *)this,name);
      std::operator<<(&local_190,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      goto LAB_00142f3e;
    }
    dVar2 = this->wienerStdDev * this->wienerStdDev;
  }
  std::ostream::_M_insert<double>(dVar2);
LAB_00142f3e:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string Wiener::getParameter(const string& name) const
{
	stringstream param;
if (name == "mean")
		param << wienerMean / (wienerSqrtDt * wienerSqrtDt);
	else if (name == "variance")
		param << wienerStdDev*wienerStdDev;
	else
		param << StochasticVariable::getParameter(name);
		
	return param.str();
}